

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

bool __thiscall
despot::Logger::SummarizeStep
          (Logger *this,int step,int round,bool terminal,ACT_TYPE action,OBS_TYPE obs,
          double step_start_t)

{
  double dVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  log_ostream *plVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar7;
  double dVar8;
  timeval tv;
  timeval local_40;
  State *pSVar5;
  
  poVar4 = this->out_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"-----------------------------------Round ",0x29);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,round);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Step ",6);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,step);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"-----------------------------------",0x23);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((DAT_00192e10 == 0) && (this->out_ != (ostream *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out_,"- Action = ",0xb);
    (*this->model_->_vptr_DSPOMDP[0x13])(this->model_,(ulong)(uint)action,this->out_);
  }
  iVar3 = (*this->world_->_vptr_World[4])();
  pSVar5 = (State *)CONCAT44(extraout_var,iVar3);
  this->state_ = pSVar5;
  if (pSVar5 == (State *)0x0) {
    pSVar5 = (State *)0x0;
  }
  else if (((DAT_00192e10 & 1) == 0) && (this->out_ != (ostream *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out_,"- State:\n",9);
    (*this->model_->_vptr_DSPOMDP[0x11])(this->model_,this->state_,this->out_);
    pSVar5 = this->state_;
  }
  if ((((DAT_00192e10 & 1) == 0) && (this->out_ != (ostream *)0x0)) && (pSVar5 != (State *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out_,"- Observation = ",0x10);
    (*this->model_->_vptr_DSPOMDP[0x12])(this->model_,this->state_,obs,this->out_);
    pSVar5 = this->state_;
  }
  if (((pSVar5 != (State *)0x0) && (DAT_00192e10 == 0)) && (this->out_ != (ostream *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(this->out_,"- ObsProb = ",0xc);
    (*this->model_->_vptr_DSPOMDP[7])(this->model_,obs,this->state_,(ulong)(uint)action);
    poVar4 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  iVar3 = std::__cxx11::string::compare((char *)&this->world_type_);
  if (iVar3 == 0) {
    this->reward_ = (double)this->world_[2]._vptr_World;
  }
  else if (this->state_ != (State *)0x0) {
    (*this->model_->_vptr_DSPOMDP[6])(this->model_,this->state_,(ulong)(uint)action);
    this->reward_ = extraout_XMM0_Qa_00;
    (*this->model_->_vptr_DSPOMDP[10])();
    if (extraout_XMM0_Qa_01 < extraout_XMM0_Qa_00) {
      this->reward_ = 0.0;
      iVar3 = logging::level();
      if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
        plVar6 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar6->super_ostream,
                   "[Logger::SummarizeStep] Reward function has not been defined in DSPOMDP model",
                   0x4d);
        std::ios::widen((char)(plVar6->super_ostream)._vptr_basic_ostream[-3] + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
      }
    }
  }
  dVar7 = pow(DAT_00192dc8,(double)this->step_);
  this->total_discounted_reward_ = dVar7 * this->reward_ + this->total_discounted_reward_;
  this->total_undiscounted_reward_ = this->reward_ + this->total_undiscounted_reward_;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  dVar7 = ((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - step_start_t;
  if (terminal) {
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[RunStep] Time for step: actual / allocated = ",0x2e);
      poVar4 = std::ostream::_M_insert<double>(dVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
      poVar4 = std::ostream::_M_insert<double>(EvalLog::allocated_time);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if ((DAT_00192e10 == 0) && (poVar4 = this->out_, poVar4 != (ostream *)0x0)) {
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    this->step_ = this->step_ + 1;
  }
  else {
    cVar2 = (char)this->out_;
    std::ios::widen((char)this->out_->_vptr_basic_ostream[-3] + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    this->step_ = this->step_ + 1;
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[main] Time for step: actual / allocated = ",0x2b);
      poVar4 = std::ostream::_M_insert<double>(dVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
      poVar4 = std::ostream::_M_insert<double>(EvalLog::allocated_time);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    if ((DAT_00192e10 == 0) && (this->out_ != (ostream *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(this->out_,"- Reward = ",0xb);
      poVar4 = std::ostream::_M_insert<double>(this->reward_);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"- Current rewards:",0x12);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      poVar4 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"  discounted / undiscounted = ",0x1e);
      poVar4 = std::ostream::_M_insert<double>(this->total_discounted_reward_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
      poVar4 = std::ostream::_M_insert<double>(this->total_undiscounted_reward_);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    dVar1 = this->target_finish_time_;
    if ((dVar1 != -1.0) || (NAN(dVar1))) {
      if (EvalLog::allocated_time * 0.99 <= dVar7) {
        if (EvalLog::allocated_time < dVar7) {
          dVar8 = (dVar7 - EvalLog::allocated_time) / (EvalLog::allocated_time + 1e-06);
          dVar7 = 0.02;
          if (0.02 <= dVar8) {
            dVar7 = dVar8;
          }
          dVar8 = 0.05;
          if (dVar7 <= 0.05) {
            dVar8 = dVar7;
          }
          EvalLog::plan_time_ratio = EvalLog::plan_time_ratio - dVar8;
        }
      }
      else {
        dVar7 = (double)(~-(ulong)(EvalLog::plan_time_ratio < 1.0) & (ulong)EvalLog::plan_time_ratio
                        | (ulong)(EvalLog::plan_time_ratio + 0.01) &
                          -(ulong)(EvalLog::plan_time_ratio < 1.0));
        if (((EvalLog::plan_time_ratio < 1.0) || (1.0 < dVar7)) &&
           (EvalLog::plan_time_ratio = 1.0, dVar7 <= 1.0)) {
          EvalLog::plan_time_ratio = dVar7;
        }
      }
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      EvalLog::curr_inst_remaining_budget =
           dVar1 - ((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec);
      EvalLog::allocated_time = 0.0;
      if ((1 < EvalLog::curr_inst_remaining_steps) &&
         (EvalLog::allocated_time =
               (EvalLog::curr_inst_remaining_budget + -2.0) /
               (double)(EvalLog::curr_inst_remaining_steps + -1), 5.0 < EvalLog::allocated_time)) {
        EvalLog::allocated_time = 5.0;
      }
      Globals::config = EvalLog::allocated_time * EvalLog::plan_time_ratio;
      EvalLog::curr_inst_remaining_steps = EvalLog::curr_inst_remaining_steps + -1;
    }
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[main] Time per move set to ",0x1c);
      poVar4 = std::ostream::_M_insert<double>(Globals::config);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 2 < iVar3)) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[main] Plan time ratio set to ",0x1e);
      poVar4 = std::ostream::_M_insert<double>(EvalLog::plan_time_ratio);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return terminal;
}

Assistant:

bool Logger::SummarizeStep(int step, int round, bool terminal, ACT_TYPE action,
		OBS_TYPE obs, double step_start_t) {

	//Output step results
	*out_ << "-----------------------------------Round " << round << " Step "
			<< step << "-----------------------------------" << endl;
	if (!Globals::config.silence && out_) {
		*out_ << "- Action = ";
		model_->PrintAction(action, *out_);
	}

	state_ = world_->GetCurrentState();

	if (state_ != NULL) {
		if (!Globals::config.silence && out_) {
			*out_ << "- State:\n";
			model_->PrintState(*state_, *out_);
		}
	}

	if (!Globals::config.silence && out_ && state_ != NULL) {
		*out_ << "- Observation = ";
		model_->PrintObs(*state_, obs, *out_);
	}

	if (state_ != NULL) {
		if (!Globals::config.silence && out_)
			*out_ << "- ObsProb = " << model_->ObsProb(obs, *state_, action)
					<< endl;
	}

	//Record step reward
	if (world_type_ == "pomdp")
		reward_ = static_cast<POMDPWorld*>(world_)->step_reward_;
	else if (state_ != NULL) {
		reward_ = model_->Reward(*state_, action);
		if (reward_ > model_->GetMaxReward()) { //invalid reward from model_->Reward
			reward_ = 0;
			logd
					<< "[Logger::SummarizeStep] Reward function has not been defined in DSPOMDP model"
					<< endl;
		}
	}
	total_discounted_reward_ += Globals::Discount(step_) * reward_;
	total_undiscounted_reward_ += reward_;

	//Report step time
	double step_end_t = get_time_second();
	double step_time = (step_end_t - step_start_t);
	if (terminal) {
		logi << "[RunStep] Time for step: actual / allocated = " << step_time
				<< " / " << EvalLog::allocated_time << endl;
		if (!Globals::config.silence && out_)
			*out_ << endl;
		step_++;
		return true;
	}
	*out_ << endl;
	step_++;

	//Record time per move

	logi << "[main] Time for step: actual / allocated = " << step_time << " / "
			<< EvalLog::allocated_time << endl;

	if (!Globals::config.silence && out_)
		*out_ << "- Reward = " << reward_ << endl << "- Current rewards:"
				<< endl << "  discounted / undiscounted = "
				<< total_discounted_reward_ << " / "
				<< total_undiscounted_reward_ << endl;

	if (target_finish_time_ != -1) {
		if (step_time < 0.99 * EvalLog::allocated_time) {
			if (EvalLog::plan_time_ratio < 1.0)
				EvalLog::plan_time_ratio += 0.01;
			if (EvalLog::plan_time_ratio > 1.0)
				EvalLog::plan_time_ratio = 1.0;
		} else if (step_time > EvalLog::allocated_time) {
			double delta = (step_time - EvalLog::allocated_time)
					/ (EvalLog::allocated_time + 1E-6);
			if (delta < 0.02)
				delta = 0.02; // Minimum reduction per step
			if (delta > 0.05)
				delta = 0.05; // Maximum reduction per step
			EvalLog::plan_time_ratio -= delta;
			// if (EvalLog::plan_time_ratio < 0)
			// EvalLog::plan_time_ratio = 0;
		}

		EvalLog::curr_inst_remaining_budget = target_finish_time_
				- get_time_second();
		EvalLog::curr_inst_remaining_steps--;

		if (EvalLog::curr_inst_remaining_steps <= 0) {
			EvalLog::allocated_time = 0;
		} else {
			EvalLog::allocated_time =
					(EvalLog::curr_inst_remaining_budget - 2.0)
							/ EvalLog::curr_inst_remaining_steps;

			if (EvalLog::allocated_time > 5.0)
				EvalLog::allocated_time = 5.0;
		}

		Globals::config.time_per_move = EvalLog::plan_time_ratio
				* EvalLog::allocated_time;
	}
	logi << "[main] Time per move set to " << Globals::config.time_per_move
			<< endl;
	logi << "[main] Plan time ratio set to " << EvalLog::plan_time_ratio
			<< endl;

	return false;
}